

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void f3b(int (*a) [22])

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  scoped_lock l;
  
  if ((int)x.super___atomic_base<int>._M_i < 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)((int)x.super___atomic_base<int>._M_i < 8);
  }
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)success_counter.super___atomic_base<int>._M_i + uVar1);
  UNLOCK();
  inwritemode = true;
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f3b ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*a)[0]);
  std::operator<<(poVar2," begin: ");
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  (*a)[0] = (*a)[0] + 1;
  fun(false,600);
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"f3b ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*a)[0]);
  std::operator<<(poVar2," end: ");
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2,"\n-------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  inwritemode = false;
  LOCK();
  x.super___atomic_base<int>._M_i = (__atomic_base<int>)-0x100;
  UNLOCK();
  second_round = true;
  return;
}

Assistant:

void f3b(int (&a)[22])
{ 
  success_counter.fetch_add((x >= 0) && (x < 8)); //f3 must have finished
  inwritemode = true;
  LOG("f3b " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3b " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << "\n-------------");
  inwritemode = false;
  x = -256;
  second_round = true;
}